

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O2

void ddd::utils::read_vector<ddd::BlockLink>
               (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *vec,istream *is)

{
  pointer pBVar1;
  size_t size;
  unsigned_long local_20;
  
  pBVar1 = (vec->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
      super__Vector_impl_data._M_finish != pBVar1) {
    (vec->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
    super__Vector_impl_data._M_finish = pBVar1;
  }
  local_20 = 0;
  read_value<unsigned_long>(&local_20,is);
  std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::resize(vec,local_20);
  std::istream::read((char *)is,
                     (long)(vec->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

inline void read_vector(std::vector<T>& vec, std::istream& is) {
  vec.clear();
  size_t size = 0;
  read_value(size, is);
  vec.resize(size);
  is.read(reinterpret_cast<char*>(&vec[0]), sizeof(T) * size);
}